

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.c
# Opt level: O0

int rtosc_arg_vals_cmp_has_next
              (rtosc_arg_val_itr *litr,rtosc_arg_val_itr *ritr,size_t lsize,size_t rsize)

{
  int32_t iVar1;
  ulong in_RCX;
  ulong in_RDX;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  bool local_22;
  bool local_21;
  
  local_21 = false;
  if (((ulong)in_RDI[1] < in_RDX) && (local_21 = false, (ulong)in_RSI[1] < in_RCX)) {
    local_22 = true;
    if ((*(char *)*in_RDI == '-') && (local_22 = true, *(char *)*in_RSI == '-')) {
      iVar1 = rtosc_av_rep_num((rtosc_arg_val_t *)0x10a81d);
      local_22 = true;
      if (iVar1 == 0) {
        iVar1 = rtosc_av_rep_num((rtosc_arg_val_t *)0x10a837);
        local_22 = iVar1 != 0;
      }
    }
    local_21 = local_22;
  }
  return (int)local_21;
}

Assistant:

int rtosc_arg_vals_cmp_has_next(const rtosc_arg_val_itr* litr,
                                const rtosc_arg_val_itr* ritr,
                                size_t lsize, size_t rsize)
{
    return     (litr->i < lsize) && (ritr->i < rsize)
            && (litr->av->type != '-' || ritr->av->type != '-' ||
                rtosc_av_rep_num(litr->av) || rtosc_av_rep_num(ritr->av));
}